

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetPropertyStr(JSContext *ctx,JSValue this_obj,char *prop,JSValue val)

{
  JSAtom prop_00;
  int iVar1;
  size_t len;
  
  len = strlen(prop);
  prop_00 = JS_NewAtomLen(ctx,prop,len);
  iVar1 = JS_SetPropertyInternal(ctx,this_obj,prop_00,val,0x4000);
  JS_FreeAtom(ctx,prop_00);
  return iVar1;
}

Assistant:

int JS_SetPropertyStr(JSContext *ctx, JSValueConst this_obj,
                      const char *prop, JSValue val)
{
    JSAtom atom;
    int ret;
    atom = JS_NewAtom(ctx, prop);
    ret = JS_SetPropertyInternal(ctx, this_obj, atom, val, JS_PROP_THROW);
    JS_FreeAtom(ctx, atom);
    return ret;
}